

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_flush_one_mmuidx_locked(CPUArchState_conflict30 *env,int mmu_idx,int64_t now)

{
  ulong uVar1;
  long lVar2;
  uc_struct_conflict15 *uc;
  MemoryRegion *mr;
  hwaddr hVar3;
  long lVar4;
  ulong uVar5;
  gpointer pvVar6;
  MemoryRegionSection *pMVar7;
  int iVar8;
  ulong in_RCX;
  uint extraout_EDX;
  undefined8 *puVar9;
  hwaddr *phVar10;
  MemOp op;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint32_t *puVar15;
  ulong unaff_R13;
  gsize __n;
  ulong uVar16;
  bool bVar17;
  uint64_t uStack_60;
  undefined8 *puStack_58;
  uint32_t *puStack_50;
  ulong uStack_48;
  ulong uStack_40;
  undefined8 uStack_38;
  
  lVar11 = (long)mmu_idx;
  lVar4 = lVar11 * 0x2b0;
  puVar9 = (undefined8 *)((long)env + lVar4 + -0x850);
  lVar12 = lVar11 * 0x10;
  uVar13 = (*(ulong *)(env->gpr_a + lVar11 * 4 + -0x10) >> 6) + 1;
  uVar1 = *(ulong *)((long)env + lVar4 + -0x838);
  if (*(ulong *)((long)env + lVar4 + -0x840) < uVar1) {
    *(ulong *)((long)env + lVar4 + -0x840) = uVar1;
  }
  lVar14 = *(long *)((long)env + lVar4 + -0x848) + 100000000;
  lVar2 = *(long *)((long)env + lVar4 + -0x840);
  uVar5 = (ulong)(lVar2 * 100) / uVar13;
  if (uVar5 < 0x47) {
    in_RCX = CONCAT71((int7)(in_RCX >> 8),now <= lVar14);
    uVar16 = uVar13;
    if (uVar5 < 0x1e && now > lVar14) {
      uVar5 = 0x40;
      uVar16 = lVar2 - 1;
      if (uVar16 != 0) {
        uVar5 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = uVar5 ^ 0x3f;
      }
      iVar8 = (int)uVar5 + -1;
      uVar16 = (ulong)(lVar2 == 0);
      if (uVar5 != 0) {
        uVar16 = 0x8000000000000000 >> ((byte)iVar8 & 0x3f);
      }
      bVar17 = 0x46 < (ulong)(lVar2 * 100) / uVar16;
      in_RCX = (ulong)CONCAT31((int3)((uint)iVar8 >> 8),bVar17);
      unaff_R13 = uVar16 << bVar17;
      uVar16 = 0x40;
      if (0x40 < unaff_R13) {
        uVar16 = unaff_R13;
      }
    }
  }
  else {
    uVar16 = 0x40000;
    if (uVar13 * 2 < 0x40000) {
      uVar16 = uVar13 * 2;
    }
  }
  puVar15 = env->gpr_a + lVar11 * 4 + -0x10;
  if (uVar16 == uVar13) {
    if (lVar14 < now) {
      *(int64_t *)((long)env + lVar4 + -0x848) = now;
      *(ulong *)((long)env + lVar4 + -0x840) = uVar1;
    }
  }
  else {
    g_free(*(gpointer *)(env->gpr_a + lVar11 * 4 + -0xe));
    g_free(*(gpointer *)((long)env + lVar4 + -0x5a8));
    *(int64_t *)((long)env + lVar4 + -0x848) = now;
    *(undefined8 *)((long)env + lVar4 + -0x840) = 0;
    *(ulong *)puVar15 = uVar16 * 0x40 + -0x40;
    pvVar6 = g_try_malloc_n(uVar16,0x40);
    *(gpointer *)(env->gpr_a + lVar11 * 4 + -0xe) = pvVar6;
    phVar10 = (hwaddr *)0x10;
    pvVar6 = g_try_malloc_n(uVar16,0x10);
    *(gpointer *)((long)env + lVar4 + -0x5a8) = pvVar6;
    if (pvVar6 != (gpointer)0x0) {
      phVar10 = (hwaddr *)0x0;
      memset(pvVar6,0,uVar16 << 4);
    }
    while( true ) {
      op = (MemOp)lVar12;
      pvVar6 = *(gpointer *)(env->gpr_a + lVar11 * 4 + -0xe);
      if ((pvVar6 != (gpointer)0x0) && (*(long *)((long)env + lVar4 + -0x5a8) != 0)) break;
      if (uVar16 == 0x40) {
        tlb_flush_one_mmuidx_locked_cold_1();
        uStack_38 = 0x40;
        uc = *(uc_struct_conflict15 **)((long)pvVar6 + -0x888);
        puStack_58 = puVar9;
        puStack_50 = puVar15;
        uStack_48 = unaff_R13;
        uStack_40 = uVar16;
        pMVar7 = iotlb_to_section_tricore
                           ((CPUState *)((long)pvVar6 + -0x8a30),*phVar10,
                            *(MemTxAttrs *)(phVar10 + 1));
        mr = pMVar7->mr;
        hVar3 = *phVar10;
        *(ulong *)((long)pvVar6 + -0x8b8) = in_RCX;
        if (*(int *)((long)pvVar6 + -0x894) == 0) {
          cpu_io_recompile_tricore((CPUState *)((long)pvVar6 + -0x8a30),in_RCX);
        }
        memory_region_dispatch_read_tricore
                  (uc,(MemoryRegion_conflict *)mr,
                   (ulong)extraout_EDX + (ulong)((uint)hVar3 & 0xffffc000),&uStack_60,op,
                   *(MemTxAttrs *)(phVar10 + 1));
        return;
      }
      uVar16 = uVar16 >> 1;
      if (uVar16 < 0x41) {
        uVar16 = 0x40;
      }
      *(ulong *)puVar15 = uVar16 * 0x40 + -0x40;
      g_free(pvVar6);
      g_free(*(gpointer *)((long)env + lVar4 + -0x5a8));
      pvVar6 = g_try_malloc_n(uVar16,0x40);
      *(gpointer *)(env->gpr_a + lVar11 * 4 + -0xe) = pvVar6;
      phVar10 = (hwaddr *)0x10;
      pvVar6 = g_try_malloc_n(uVar16,0x10);
      *(gpointer *)((long)env + lVar4 + -0x5a8) = pvVar6;
    }
  }
  *(undefined8 *)((long)env + lVar4 + -0x838) = 0;
  *(undefined8 *)((long)env + lVar4 + -0x830) = 0;
  *puVar9 = 0xffffffffffffffff;
  memset(*(void **)(env->gpr_a + lVar11 * 4 + -0xe),0xff,*(long *)puVar15 + 0x40);
  memset((void *)((long)env + lVar4 + -0x828),0xff,0x200);
  return;
}

Assistant:

static void tlb_flush_one_mmuidx_locked(CPUArchState *env, int mmu_idx,
                                        int64_t now)
{
    CPUTLBDesc *desc = &env_tlb(env)->d[mmu_idx];
    CPUTLBDescFast *fast = &env_tlb(env)->f[mmu_idx];

    tlb_mmu_resize_locked(env->uc, desc, fast, now);
    tlb_mmu_flush_locked(desc, fast);
}